

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utest.h
# Opt level: O0

int utest_main(int argc,char **argv)

{
  int iVar1;
  int64_t iVar2;
  int64_t iVar3;
  size_t failed_testcase_index;
  int64_t ns;
  int result;
  char cStack_7c;
  char output_str [10];
  char filter_str [10];
  char help_str [7];
  char *colours [3];
  long lStack_48;
  int use_colours;
  uint64_t ran_tests;
  char *filter;
  size_t failed_testcases_length;
  size_t *failed_testcases;
  size_t index;
  uint64_t failed;
  char **argv_local;
  int argc_local;
  
  index = 0;
  failed_testcases_length = 0;
  filter = (char *)0x0;
  ran_tests = 0;
  lStack_48 = 0;
  iVar1 = isatty(1);
  stack0xffffffffffffff98 = "\x1b[0m";
  if (iVar1 == 0) {
    for (failed_testcases = (size_t *)0x0; failed_testcases < (size_t *)0x3;
        failed_testcases = (size_t *)((long)failed_testcases + 1)) {
      *(char **)(help_str + (long)failed_testcases * 8 + -1) = "";
    }
  }
  failed_testcases = (size_t *)0x1;
  do {
    if ((size_t *)(long)argc <= failed_testcases) {
      for (failed_testcases = (size_t *)0x0; failed_testcases < utest_state.tests_length;
          failed_testcases = (size_t *)((long)failed_testcases + 1)) {
        iVar1 = utest_should_filter_test
                          ((char *)ran_tests,utest_state.tests[(long)failed_testcases].name);
        if (iVar1 == 0) {
          lStack_48 = lStack_48 + 1;
        }
      }
      printf("%s[==========]%s Running %lu test cases.\n","\x1b[32m",stack0xffffffffffffff98,
             lStack_48);
      if (utest_state.output != (FILE *)0x0) {
        fprintf((FILE *)utest_state.output,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
        fprintf((FILE *)utest_state.output,"<testsuites tests=\"%lu\" name=\"All\">\n",lStack_48);
        fprintf((FILE *)utest_state.output,"<testsuite name=\"Tests\" tests=\"%lu\">\n",lStack_48);
      }
      for (failed_testcases = (size_t *)0x0; failed_testcases < utest_state.tests_length;
          failed_testcases = (size_t *)((long)failed_testcases + 1)) {
        ns._0_4_ = 0;
        iVar1 = utest_should_filter_test
                          ((char *)ran_tests,utest_state.tests[(long)failed_testcases].name);
        if (iVar1 == 0) {
          printf("%s[ RUN      ]%s %s\n","\x1b[32m",stack0xffffffffffffff98,
                 utest_state.tests[(long)failed_testcases].name);
          if (utest_state.output != (FILE *)0x0) {
            fprintf((FILE *)utest_state.output,"<testcase name=\"%s\">",
                    utest_state.tests[(long)failed_testcases].name);
          }
          iVar2 = utest_ns();
          (*utest_state.tests[(long)failed_testcases].func)
                    ((int *)&ns,utest_state.tests[(long)failed_testcases].index);
          iVar3 = utest_ns();
          if (utest_state.output != (FILE *)0x0) {
            fprintf((FILE *)utest_state.output,"</testcase>\n");
          }
          if ((int)ns == 0) {
            printf("%s[       OK ]%s %s (%ldns)\n","\x1b[32m",stack0xffffffffffffff98,
                   utest_state.tests[(long)failed_testcases].name,iVar3 - iVar2);
          }
          else {
            failed_testcases_length =
                 (size_t)realloc((void *)failed_testcases_length,(long)(filter + 1) * 8);
            *(size_t **)(failed_testcases_length + (long)filter * 8) = failed_testcases;
            index = index + 1;
            printf("%s[  FAILED  ]%s %s (%ldns)\n","\x1b[31m",stack0xffffffffffffff98,
                   utest_state.tests[(long)failed_testcases].name,iVar3 - iVar2);
            filter = filter + 1;
          }
        }
      }
      printf("%s[==========]%s %lu test cases ran.\n","\x1b[32m",stack0xffffffffffffff98,lStack_48);
      printf("%s[  PASSED  ]%s %lu tests.\n","\x1b[32m",stack0xffffffffffffff98,lStack_48 - index);
      if (index != 0) {
        printf("%s[  FAILED  ]%s %lu tests, listed below:\n","\x1b[31m",stack0xffffffffffffff98,
               index);
        for (failed_testcases = (size_t *)0x0; failed_testcases < filter;
            failed_testcases = (size_t *)((long)failed_testcases + 1)) {
          printf("%s[  FAILED  ]%s %s\n","\x1b[31m",stack0xffffffffffffff98,
                 utest_state.tests[*(long *)(failed_testcases_length + (long)failed_testcases * 8)].
                 name);
        }
      }
      if (utest_state.output != (FILE *)0x0) {
        fprintf((FILE *)utest_state.output,"</testsuite>\n</testsuites>\n");
      }
LAB_0010c876:
      for (failed_testcases = (size_t *)0x0; failed_testcases < utest_state.tests_length;
          failed_testcases = (size_t *)((long)failed_testcases + 1)) {
        free(utest_state.tests[(long)failed_testcases].name);
      }
      free((void *)failed_testcases_length);
      free(utest_state.tests);
      if (utest_state.output != (FILE *)0x0) {
        fclose((FILE *)utest_state.output);
      }
      return (int)index;
    }
    filter_str[2] = '-';
    filter_str[3] = '-';
    filter_str[4] = 'h';
    filter_str[5] = 'e';
    filter_str[6] = 'l';
    filter_str[7] = 'p';
    filter_str[8] = '\0';
    builtin_strncpy(output_str + 2,"--filter",8);
    filter_str[0] = '=';
    filter_str[1] = '\0';
    ns._5_1_ = '-';
    ns._6_1_ = '-';
    ns._7_1_ = 'o';
    result._0_1_ = 'u';
    result._1_1_ = 't';
    result._2_1_ = 'p';
    result._3_1_ = 'u';
    cStack_7c = 't';
    output_str[0] = '=';
    output_str[1] = '\0';
    iVar1 = utest_strncmp(argv[(long)failed_testcases],filter_str + 2,6);
    if (iVar1 == 0) {
      printf(
            "utest.h - the single file unit testing solution for C/C++!\nCommand line Options:\n  --help            Show this message and exit.\n  --filter=<filter> Filter the test cases to run (EG. MyTest*.a would run MyTestCase.a but not MyTestCase.b).\n  --output=<output> Output an xunit XML file to the file specified in <output>.\n"
            );
      goto LAB_0010c876;
    }
    iVar1 = utest_strncmp(argv[(long)failed_testcases],output_str + 2,9);
    if (iVar1 == 0) {
      ran_tests = (uint64_t)(argv[(long)failed_testcases] + 9);
    }
    else {
      iVar1 = utest_strncmp(argv[(long)failed_testcases],(char *)((long)&ns + 5),9);
      if (iVar1 == 0) {
        utest_state.output = utest_fopen(argv[(long)failed_testcases] + 9,"w+");
      }
    }
    failed_testcases = (size_t *)((long)failed_testcases + 1);
  } while( true );
}

Assistant:

UTEST_WEAK int utest_main(int argc, const char *const argv[]) {
  uint64_t failed = 0;
  size_t index = 0;
  size_t *failed_testcases = 0;
  size_t failed_testcases_length = 0;
  const char *filter = 0;
  uint64_t ran_tests = 0;

  enum colours { RESET, GREEN, RED };

  const int use_colours = UTEST_COLOUR_OUTPUT();
  const char *colours[] = {"\033[0m", "\033[32m", "\033[31m"};
  if (!use_colours) {
    for (index = 0; index < sizeof colours / sizeof colours[0]; index++) {
      colours[index] = "";
    }
  }
  /* loop through all arguments looking for our options */
  for (index = 1; index < UTEST_CAST(size_t, argc); index++) {
    const char help_str[] = "--help";
    const char filter_str[] = "--filter=";
    const char output_str[] = "--output=";

    if (0 == utest_strncmp(argv[index], help_str, strlen(help_str))) {
      printf("utest.h - the single file unit testing solution for C/C++!\n"
             "Command line Options:\n"
             "  --help            Show this message and exit.\n"
             "  --filter=<filter> Filter the test cases to run (EG. MyTest*.a "
             "would run MyTestCase.a but not MyTestCase.b).\n"
             "  --output=<output> Output an xunit XML file to the file "
             "specified in <output>.\n");
      goto cleanup;
    } else if (0 ==
               utest_strncmp(argv[index], filter_str, strlen(filter_str))) {
      /* user wants to filter what test cases run! */
      filter = argv[index] + strlen(filter_str);
    } else if (0 ==
               utest_strncmp(argv[index], output_str, strlen(output_str))) {
      utest_state.output = utest_fopen(argv[index] + strlen(output_str), "w+");
    }
  }

  for (index = 0; index < utest_state.tests_length; index++) {
    if (utest_should_filter_test(filter, utest_state.tests[index].name)) {
      continue;
    }

    ran_tests++;
  }

  printf("%s[==========]%s Running %" UTEST_PRIu64 " test cases.\n",
         colours[GREEN], colours[RESET], UTEST_CAST(uint64_t, ran_tests));

  if (utest_state.output) {
    fprintf(utest_state.output, "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
    fprintf(utest_state.output,
            "<testsuites tests=\"%" UTEST_PRIu64 "\" name=\"All\">\n",
            UTEST_CAST(uint64_t, ran_tests));
    fprintf(utest_state.output,
            "<testsuite name=\"Tests\" tests=\"%" UTEST_PRIu64 "\">\n",
            UTEST_CAST(uint64_t, ran_tests));
  }

  for (index = 0; index < utest_state.tests_length; index++) {
    int result = 0;
    int64_t ns = 0;

    if (utest_should_filter_test(filter, utest_state.tests[index].name)) {
      continue;
    }

    printf("%s[ RUN      ]%s %s\n", colours[GREEN], colours[RESET],
           utest_state.tests[index].name);

    if (utest_state.output) {
      fprintf(utest_state.output, "<testcase name=\"%s\">",
              utest_state.tests[index].name);
    }

    ns = utest_ns();
    utest_state.tests[index].func(&result, utest_state.tests[index].index);
    ns = utest_ns() - ns;

    if (utest_state.output) {
      fprintf(utest_state.output, "</testcase>\n");
    }

    if (0 != result) {
      const size_t failed_testcase_index = failed_testcases_length++;
      failed_testcases = UTEST_PTR_CAST(
          size_t *, realloc(UTEST_PTR_CAST(void *, failed_testcases),
                            sizeof(size_t) * failed_testcases_length));
      failed_testcases[failed_testcase_index] = index;
      failed++;
      printf("%s[  FAILED  ]%s %s (%" UTEST_PRId64 "ns)\n", colours[RED],
             colours[RESET], utest_state.tests[index].name, ns);
    } else {
      printf("%s[       OK ]%s %s (%" UTEST_PRId64 "ns)\n", colours[GREEN],
             colours[RESET], utest_state.tests[index].name, ns);
    }
  }

  printf("%s[==========]%s %" UTEST_PRIu64 " test cases ran.\n", colours[GREEN],
         colours[RESET], ran_tests);
  printf("%s[  PASSED  ]%s %" UTEST_PRIu64 " tests.\n", colours[GREEN],
         colours[RESET], ran_tests - failed);

  if (0 != failed) {
    printf("%s[  FAILED  ]%s %" UTEST_PRIu64 " tests, listed below:\n",
           colours[RED], colours[RESET], failed);
    for (index = 0; index < failed_testcases_length; index++) {
      printf("%s[  FAILED  ]%s %s\n", colours[RED], colours[RESET],
             utest_state.tests[failed_testcases[index]].name);
    }
  }

  if (utest_state.output) {
    fprintf(utest_state.output, "</testsuite>\n</testsuites>\n");
  }

cleanup:
  for (index = 0; index < utest_state.tests_length; index++) {
    free(UTEST_PTR_CAST(void *, utest_state.tests[index].name));
  }

  free(UTEST_PTR_CAST(void *, failed_testcases));
  free(UTEST_PTR_CAST(void *, utest_state.tests));

  if (utest_state.output) {
    fclose(utest_state.output);
  }

  return UTEST_CAST(int, failed);
}